

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
               (pair<double,_int> *begin,long end,int param_3,uint param_4)

{
  pair<double,_int> *ppVar1;
  double dVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 uVar5;
  bool bVar6;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var7;
  ulong uVar8;
  ulong uVar9;
  undefined8 *puVar10;
  pair<double,_int> *ppVar11;
  long lVar12;
  ulong uVar13;
  pair<__gnu_cxx::__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_bool>
  pVar14;
  int local_50;
  uint local_4c;
  
  local_4c = param_4;
  local_50 = param_3;
  do {
    while( true ) {
      uVar8 = end - (long)begin >> 4;
      if ((long)uVar8 < 0x18) {
        if ((local_4c & 1) == 0) {
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                    (begin,end);
          return;
        }
        insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                  (begin,end);
        return;
      }
      uVar13 = uVar8 >> 1;
      ppVar1 = begin + uVar13;
      if (uVar8 < 0x81) {
        sort3<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                  (ppVar1,begin,end + -0x10);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                  (begin,ppVar1,end + -0x10);
        sort3<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                  (begin + 1,begin + (uVar13 - 1),end + -0x20);
        sort3<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                  (begin + 2,begin + uVar13 + 1,end + -0x30);
        sort3<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                  (begin + (uVar13 - 1),ppVar1,begin + uVar13 + 1);
        dVar2 = begin->first;
        begin->first = ppVar1->first;
        ppVar1->first = dVar2;
        iVar4 = begin->second;
        begin->second = ppVar1->second;
        ppVar1->second = iVar4;
      }
      if (((local_4c & 1) != 0) || (bVar6 = std::operator<(begin + -1,begin), bVar6)) break;
      _Var7 = partition_left<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                        (begin,end);
      begin = _Var7._M_current + 1;
    }
    pVar14 = partition_right<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                       (begin,end);
    _Var7 = pVar14.first._M_current;
    uVar9 = (long)_Var7._M_current - (long)begin >> 4;
    ppVar1 = _Var7._M_current + 1;
    uVar13 = end - (long)ppVar1 >> 4;
    if (((long)uVar9 < (long)(uVar8 >> 3)) || ((long)uVar13 < (long)(uVar8 >> 3))) {
      local_50 = local_50 + -1;
      if (local_50 == 0) {
        std::
        make_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                  (begin,end);
        std::
        sort_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                  (begin,end);
        return;
      }
      if (0x17 < (long)uVar9) {
        uVar8 = uVar9 >> 2;
        dVar2 = begin->first;
        begin->first = begin[uVar8].first;
        begin[uVar8].first = dVar2;
        iVar4 = begin->second;
        begin->second = begin[uVar8].second;
        begin[uVar8].second = iVar4;
        ppVar11 = _Var7._M_current + -uVar8;
        dVar2 = _Var7._M_current[-1].first;
        _Var7._M_current[-1].first = ppVar11->first;
        ppVar11->first = dVar2;
        iVar4 = _Var7._M_current[-1].second;
        _Var7._M_current[-1].second = ppVar11->second;
        ppVar11->second = iVar4;
        if (0x80 < uVar9) {
          dVar2 = begin[1].first;
          begin[1].first = begin[uVar8 + 1].first;
          begin[uVar8 + 1].first = dVar2;
          iVar4 = begin[1].second;
          begin[1].second = begin[uVar8 + 1].second;
          begin[uVar8 + 1].second = iVar4;
          dVar2 = begin[2].first;
          begin[2].first = begin[uVar8 + 2].first;
          begin[uVar8 + 2].first = dVar2;
          iVar4 = begin[2].second;
          begin[2].second = begin[uVar8 + 2].second;
          begin[uVar8 + 2].second = iVar4;
          lVar12 = -2 - uVar8;
          uVar8 = ~uVar8;
          dVar2 = _Var7._M_current[-2].first;
          _Var7._M_current[-2].first = _Var7._M_current[uVar8].first;
          _Var7._M_current[uVar8].first = dVar2;
          iVar4 = _Var7._M_current[-2].second;
          _Var7._M_current[-2].second = _Var7._M_current[uVar8].second;
          _Var7._M_current[uVar8].second = iVar4;
          dVar2 = _Var7._M_current[-3].first;
          _Var7._M_current[-3].first = _Var7._M_current[lVar12].first;
          _Var7._M_current[lVar12].first = dVar2;
          iVar4 = _Var7._M_current[-3].second;
          _Var7._M_current[-3].second = _Var7._M_current[lVar12].second;
          _Var7._M_current[lVar12].second = iVar4;
        }
      }
      if (0x17 < (long)uVar13) {
        uVar8 = uVar13 >> 2;
        dVar2 = _Var7._M_current[1].first;
        _Var7._M_current[1].first = _Var7._M_current[uVar8 + 1].first;
        _Var7._M_current[uVar8 + 1].first = dVar2;
        iVar4 = _Var7._M_current[1].second;
        _Var7._M_current[1].second = _Var7._M_current[uVar8 + 1].second;
        _Var7._M_current[uVar8 + 1].second = iVar4;
        puVar10 = (undefined8 *)(end + uVar8 * -0x10);
        uVar3 = *(undefined8 *)(end + -0x10);
        *(undefined8 *)(end + -0x10) = *puVar10;
        *puVar10 = uVar3;
        uVar5 = *(undefined4 *)(end + -8);
        *(undefined4 *)(end + -8) = *(undefined4 *)(puVar10 + 1);
        *(undefined4 *)(puVar10 + 1) = uVar5;
        if (0x80 < uVar13) {
          dVar2 = _Var7._M_current[2].first;
          _Var7._M_current[2].first = _Var7._M_current[uVar8 + 2].first;
          _Var7._M_current[uVar8 + 2].first = dVar2;
          iVar4 = _Var7._M_current[2].second;
          _Var7._M_current[2].second = _Var7._M_current[uVar8 + 2].second;
          _Var7._M_current[uVar8 + 2].second = iVar4;
          dVar2 = _Var7._M_current[3].first;
          _Var7._M_current[3].first = _Var7._M_current[uVar8 + 3].first;
          _Var7._M_current[uVar8 + 3].first = dVar2;
          iVar4 = _Var7._M_current[3].second;
          _Var7._M_current[3].second = _Var7._M_current[uVar8 + 3].second;
          _Var7._M_current[uVar8 + 3].second = iVar4;
          lVar12 = ~uVar8 * 0x10;
          uVar3 = *(undefined8 *)(end + -0x20);
          *(undefined8 *)(end + -0x20) = *(undefined8 *)(end + lVar12);
          *(undefined8 *)(end + lVar12) = uVar3;
          uVar5 = *(undefined4 *)(end + -0x18);
          *(undefined4 *)(end + -0x18) = *(undefined4 *)(end + 8 + lVar12);
          *(undefined4 *)(end + 8 + lVar12) = uVar5;
          lVar12 = (-2 - uVar8) * 0x10;
          uVar3 = *(undefined8 *)(end + -0x30);
          *(undefined8 *)(end + -0x30) = *(undefined8 *)(end + lVar12);
          *(undefined8 *)(end + lVar12) = uVar3;
          uVar5 = *(undefined4 *)(end + -0x28);
          *(undefined4 *)(end + -0x28) = *(undefined4 *)(end + 8 + lVar12);
          *(undefined4 *)(end + 8 + lVar12) = uVar5;
        }
      }
    }
    else if (((((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
             (bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                                (begin,_Var7._M_current), bVar6)) &&
            (bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                               (ppVar1,end), bVar6)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
              (begin,_Var7._M_current,local_50,local_4c & 1);
    local_4c = 0;
    begin = ppVar1;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }